

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (in == (uchar *)0x0) {
    *inlen = 0;
    *outlen = 0;
    iVar4 = 0;
  }
  else {
    iVar1 = *outlen;
    iVar2 = *inlen;
    iVar3 = iVar1;
    if (iVar2 <= iVar1) {
      iVar3 = iVar2;
    }
    iVar4 = -3;
    if (iVar2 <= iVar1) {
      iVar4 = iVar2;
    }
    memcpy(out,in,(long)iVar3);
    *outlen = iVar3;
    *inlen = iVar3;
  }
  return iVar4;
}

Assistant:

static int
UTF8ToUTF8(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen,
           void *vctxt ATTRIBUTE_UNUSED) {
    int len;
    int ret;

    if (in == NULL) {
        *inlen = 0;
        *outlen = 0;
        return(XML_ENC_ERR_SUCCESS);
    }

    if (*outlen < *inlen) {
	len = *outlen;
        ret = XML_ENC_ERR_SPACE;
    } else {
	len = *inlen;
        ret = len;
    }

    memcpy(out, in, len);

    *outlen = len;
    *inlen = len;
    return(ret);
}